

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

xmlParserErrors xmlSaveFinish(xmlSaveCtxtPtr ctxt)

{
  int iVar1;
  xmlParserErrors local_1c;
  int ret;
  xmlSaveCtxtPtr ctxt_local;
  
  if (ctxt == (xmlSaveCtxtPtr)0x0) {
    ctxt_local._4_4_ = XML_ERR_INTERNAL_ERROR;
  }
  else {
    iVar1 = xmlOutputBufferClose(ctxt->buf);
    ctxt->buf = (xmlOutputBufferPtr)0x0;
    if (iVar1 < 0) {
      local_1c = -iVar1;
    }
    else {
      local_1c = XML_ERR_OK;
    }
    xmlFreeSaveCtxt(ctxt);
    ctxt_local._4_4_ = local_1c;
  }
  return ctxt_local._4_4_;
}

Assistant:

xmlParserErrors
xmlSaveFinish(xmlSaveCtxtPtr ctxt)
{
    int ret;

    if (ctxt == NULL)
        return(XML_ERR_INTERNAL_ERROR);

    ret = xmlOutputBufferClose(ctxt->buf);
    ctxt->buf = NULL;
    if (ret < 0)
        ret = -ret;
    else
        ret = XML_ERR_OK;

    xmlFreeSaveCtxt(ctxt);
    return(ret);
}